

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

void __thiscall
lf::refinement::MeshHierarchy::MeshHierarchy
          (MeshHierarchy *this,shared_ptr<lf::mesh::Mesh> *base_mesh,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
          *mesh_factory)

{
  allocator<lf::refinement::CellChildInfo> *this_00;
  allocator<lf::refinement::EdgeChildInfo> *this_01;
  allocator<lf::refinement::PointChildInfo> *this_02;
  allocator<lf::refinement::ParentInfo> *paVar1;
  Entity *T;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  int iVar5;
  sub_idx_t sVar6;
  uint uVar7;
  runtime_error *prVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  reference ppEVar10;
  reference this_03;
  reference pvVar11;
  allocator<bool> local_592;
  bool local_591;
  vector<bool,_std::allocator<bool>_> local_590;
  value_type local_568;
  allocator<lf::refinement::ParentInfo> local_519;
  undefined1 local_518 [8];
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> point_parent_info;
  undefined1 local_4f8 [8];
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> edge_parent_info;
  undefined1 local_4d8 [8];
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> cell_parent_info;
  undefined1 local_4b8 [8];
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
  point_child_info;
  undefined1 local_498 [8];
  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
  edge_child_info;
  undefined1 local_478 [8];
  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
  cell_child_info;
  glb_idx_t cell_index;
  Entity *cell;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *local_20;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *mesh_factory_local
  ;
  shared_ptr<lf::mesh::Mesh> *base_mesh_local;
  MeshHierarchy *this_local;
  
  this->_vptr_MeshHierarchy = (_func_int **)&PTR__MeshHierarchy_00f79708;
  local_20 = mesh_factory;
  mesh_factory_local =
       (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)base_mesh;
  base_mesh_local = (shared_ptr<lf::mesh::Mesh> *)this;
  std::vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>::
  vector(&this->meshes_);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
            (&this->mesh_factory_,mesh_factory);
  std::
  vector<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
  ::vector(&this->point_child_infos_);
  std::
  vector<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
  ::vector(&this->edge_child_infos_);
  std::
  vector<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
  ::vector(&this->cell_child_infos_);
  std::
  vector<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>,_std::allocator<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>_>_>
  ::vector(&this->parent_infos_);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->edge_marked_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->refinement_edges_);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)mesh_factory_local);
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"No valid mesh supplied");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"base_mesh",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x25,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  iVar5 = (**peVar9->_vptr_Mesh)();
  if (iVar5 != 2) {
    std::__cxx11::stringstream::stringstream(local_3b0);
    std::operator<<(local_3a0,"Implemented only for 2D meshes");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"base_mesh->DimMesh() == 2",&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_3f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3d0,&local_3f8,0x26,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>::
  push_back(&this->meshes_,(value_type *)mesh_factory_local);
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  __range2._4_4_ = (*peVar9->_vptr_Mesh[3])(peVar9,0);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<unsigned_int,unsigned_int_const&>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->refinement_edges_,(uint *)((long)&__range2 + 4),&idx_nil);
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  iVar5 = (*peVar9->_vptr_Mesh[2])(peVar9,0);
  __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar5);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  cell = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&cell);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppEVar10 = __gnu_cxx::
               __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
               ::operator*(&__end2);
    T = *ppEVar10;
    peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_factory_local);
    cell_child_info.
    super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (*peVar9->_vptr_Mesh[5])(peVar9,T);
    iVar5 = (*T->_vptr_Entity[4])();
    cell_child_info.
    super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = (undefined1)iVar5;
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType
                      ((RefEl *)((long)&cell_child_info.
                                        super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    cell_child_info.
    super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = lf::base::RefEl::kTria();
    RVar4 = lf::base::RefEl::operator_cast_to_RefElType
                      ((RefEl *)((long)&cell_child_info.
                                        super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    if (RVar3 == RVar4) {
      sVar6 = LongestEdge(T);
      this_03 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::back(&this->refinement_edges_);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (this_03,(ulong)cell_child_info.
                                          super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar11 = sVar6;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,0);
  this_00 = (allocator<lf::refinement::CellChildInfo> *)
            ((long)&edge_child_info.
                    super__Vector_base<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<lf::refinement::CellChildInfo>::allocator(this_00);
  std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::vector
            ((vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
              *)local_478,(ulong)uVar7,this_00);
  std::allocator<lf::refinement::CellChildInfo>::~allocator
            ((allocator<lf::refinement::CellChildInfo> *)
             ((long)&edge_child_info.
                     super__Vector_base<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,1);
  this_01 = (allocator<lf::refinement::EdgeChildInfo> *)
            ((long)&point_child_info.
                    super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<lf::refinement::EdgeChildInfo>::allocator(this_01);
  std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::vector
            ((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
              *)local_498,(ulong)uVar7,this_01);
  std::allocator<lf::refinement::EdgeChildInfo>::~allocator
            ((allocator<lf::refinement::EdgeChildInfo> *)
             ((long)&point_child_info.
                     super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,2);
  this_02 = (allocator<lf::refinement::PointChildInfo> *)
            ((long)&cell_parent_info.
                    super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<lf::refinement::PointChildInfo>::allocator(this_02);
  std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>::
  vector((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_> *)
         local_4b8,(ulong)uVar7,this_02);
  std::allocator<lf::refinement::PointChildInfo>::~allocator
            ((allocator<lf::refinement::PointChildInfo> *)
             ((long)&cell_parent_info.
                     super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
  ::push_back(&this->cell_child_infos_,(value_type *)local_478);
  std::
  vector<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
  ::push_back(&this->edge_child_infos_,(value_type *)local_498);
  std::
  vector<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
  ::push_back(&this->point_child_infos_,(value_type *)local_4b8);
  std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>::
  ~vector((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_> *
          )local_4b8);
  std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::
  ~vector((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_> *)
          local_498);
  std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::
  ~vector((vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *)
          local_478);
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,0);
  paVar1 = (allocator<lf::refinement::ParentInfo> *)
           ((long)&edge_parent_info.
                   super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<lf::refinement::ParentInfo>::allocator(paVar1);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4d8,(ulong)uVar7,paVar1);
  std::allocator<lf::refinement::ParentInfo>::~allocator
            ((allocator<lf::refinement::ParentInfo> *)
             ((long)&edge_parent_info.
                     super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,1);
  paVar1 = (allocator<lf::refinement::ParentInfo> *)
           ((long)&point_parent_info.
                   super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<lf::refinement::ParentInfo>::allocator(paVar1);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4f8,(ulong)uVar7,paVar1);
  std::allocator<lf::refinement::ParentInfo>::~allocator
            ((allocator<lf::refinement::ParentInfo> *)
             ((long)&point_parent_info.
                     super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,2);
  std::allocator<lf::refinement::ParentInfo>::allocator(&local_519);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_518,(ulong)uVar7,&local_519);
  std::allocator<lf::refinement::ParentInfo>::~allocator(&local_519);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            (local_568._M_elems,
             (vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4d8);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            (local_568._M_elems + 1,
             (vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4f8);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
            (local_568._M_elems + 2,
             (vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_518);
  std::
  vector<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>,_std::allocator<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>_>_>
  ::push_back(&this->parent_infos_,&local_568);
  std::
  array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>::
  ~array(&local_568);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_518);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4f8);
  std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
            ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
             local_4d8);
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)mesh_factory_local);
  uVar7 = (*peVar9->_vptr_Mesh[3])(peVar9,1);
  local_591 = false;
  std::allocator<bool>::allocator(&local_592);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_590,(ulong)uVar7,&local_591,&local_592);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::push_back(&this->edge_marked_,&local_590);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_590);
  std::allocator<bool>::~allocator(&local_592);
  return;
}

Assistant:

MeshHierarchy::MeshHierarchy(const std::shared_ptr<mesh::Mesh> &base_mesh,
                             std::unique_ptr<mesh::MeshFactory> mesh_factory)
    : mesh_factory_(std::move(mesh_factory)) {
  LF_VERIFY_MSG(base_mesh, "No valid mesh supplied");
  LF_VERIFY_MSG(base_mesh->DimMesh() == 2, "Implemented only for 2D meshes");
  // Set coarsest mesh
  meshes_.push_back(base_mesh);
  {
    // Refinement edge has to be set for edges
    refinement_edges_.emplace_back(base_mesh->NumEntities(0), idx_nil);
    for (const mesh::Entity *cell : base_mesh->Entities(0)) {
      const lf::base::glb_idx_t cell_index = base_mesh->Index(*cell);
      if (cell->RefEl() == lf::base::RefEl::kTria()) {
        (refinement_edges_.back())[cell_index] = LongestEdge(*cell);
      }
    }  // end loop over cells

    // Setting up child information
    std::vector<CellChildInfo> cell_child_info(base_mesh->NumEntities(0));
    std::vector<EdgeChildInfo> edge_child_info(base_mesh->NumEntities(1));
    std::vector<PointChildInfo> point_child_info(base_mesh->NumEntities(2));
    cell_child_infos_.push_back(std::move(cell_child_info));
    edge_child_infos_.push_back(std::move(edge_child_info));
    point_child_infos_.push_back(std::move(point_child_info));
  }
  {
    // No parents for entities on the coarsest level
    std::vector<ParentInfo> cell_parent_info(base_mesh->NumEntities(0));
    std::vector<ParentInfo> edge_parent_info(base_mesh->NumEntities(1));
    std::vector<ParentInfo> point_parent_info(base_mesh->NumEntities(2));
    parent_infos_.push_back({std::move(cell_parent_info),
                             std::move(edge_parent_info),
                             std::move(point_parent_info)});
  }
  edge_marked_.push_back(
      std::move(std::vector<bool>(base_mesh->NumEntities(1), false)));
}